

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupDfs(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Tim_Man_t *pTVar9;
  int local_2c;
  int nNodes;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar5 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar5;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar6 = (Aig_Obj_t **)calloc((long)iVar1,8);
    p_00->pEquivs = ppAVar6;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar6 = (Aig_Obj_t **)calloc((long)iVar1,8);
    p_00->pReprs = ppAVar6;
  }
  Aig_ManCleanData(p);
  pAVar7 = Aig_ManConst1(p_00);
  pAVar8 = Aig_ManConst1(p);
  (pAVar8->field_5).pData = pAVar7;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (pAVar7 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsCi(pAVar7);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCo(pAVar7);
        if (iVar1 != 0) {
          pAVar8 = Aig_ObjFanin0(pAVar7);
          Aig_ManDupDfs_rec(p_00,p,pAVar8);
          pAVar8 = Aig_ObjChild0Copy(pAVar7);
          pAVar8 = Aig_ObjCreateCo(p_00,pAVar8);
          (pAVar7->field_5).pData = pAVar8;
        }
      }
      else {
        pAVar8 = Aig_ObjCreateCi(p_00);
        *(ulong *)&pAVar8->field_0x18 =
             *(ulong *)&pAVar8->field_0x18 & 0xff000000ffffffff |
             (ulong)((uint)((ulong)*(undefined8 *)&pAVar7->field_0x18 >> 0x20) & 0xffffff) << 0x20;
        (pAVar7->field_5).pData = pAVar8;
      }
    }
  }
  if ((p->pEquivs == (Aig_Obj_t **)0x0) && (iVar1 = Aig_ManBufNum(p), iVar1 == 0)) {
    iVar1 = Aig_ManNodeNum(p);
    iVar2 = Aig_ManNodeNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                    ,0x25a,"Aig_Man_t *Aig_ManDupDfs(Aig_Man_t *)");
    }
  }
  if (((p->pEquivs == (Aig_Obj_t **)0x0) && (p->pReprs == (Aig_Obj_t **)0x0)) &&
     (uVar3 = Aig_ManCleanup(p_00), uVar3 != 0)) {
    printf("Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar3);
  }
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  if (p->pManTime != (void *)0x0) {
    pTVar9 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar9;
  }
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupDfs(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupDfs( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
        pNew->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    if ( p->pReprs )
        pNew->pReprs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
//            assert( pObj->Level == ((Aig_Obj_t*)pObj->pData)->Level );
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
            pObj->pData = pObjNew;
        }
    }
    assert( p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( p->pEquivs == NULL && p->pReprs == NULL && (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupDfs(): The check has failed.\n" );
    return pNew;
}